

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O3

int32 insert(heapelement_t ***heap,int32 heapsize,heapelement_t *newelement)

{
  int32 iVar1;
  heapelement_t *l1;
  heapelement_t *l2;
  int32 iVar2;
  heapelement_t **pphVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (heapsize == 0) {
    *heap = (heapelement_t **)0x0;
    pphVar3 = (heapelement_t **)0x0;
  }
  else {
    pphVar3 = *heap;
  }
  pphVar3 = (heapelement_t **)realloc(pphVar3,(long)(heapsize + 1) << 3);
  pphVar3[heapsize] = newelement;
  newelement->heapid = heapsize;
  if (0 < heapsize) {
    l1 = pphVar3[(uint)heapsize];
    uVar5 = (ulong)(uint)heapsize;
    do {
      uVar4 = (int)uVar5 - 1;
      uVar6 = (ulong)(uVar4 >> 1);
      l2 = pphVar3[uVar6];
      iVar2 = compare(l1,l2);
      if (iVar2 < 1) break;
      iVar2 = l1->heapid;
      iVar1 = l2->heapid;
      pphVar3[uVar5] = l2;
      pphVar3[uVar6] = l1;
      pphVar3[uVar5]->heapid = iVar2;
      l1->heapid = iVar1;
      uVar5 = uVar6;
    } while (1 < uVar4);
  }
  *heap = pphVar3;
  return heapsize + 1;
}

Assistant:

int32 insert(heapelement_t ***heap, int32 heapsize, heapelement_t *newelement)
{
    heapelement_t **lheap;
    int32 id, newheapsize = heapsize + 1;

    if (heapsize == 0) *heap = NULL; /* Needed for realloc to work */
    lheap = (heapelement_t**) realloc(*heap,newheapsize*sizeof(heapelement_t*));

    lheap[heapsize] = newelement;
    newelement->heapid = heapsize;

    id = heapsize;
    while (id > 0 && compare(lheap[id],lheap[PARENTID(id)]) > 0){
	SWAP(lheap[id],lheap[PARENTID(id)]);
	id = PARENTID(id);
    }

    *heap = lheap;
    return(newheapsize);
}